

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChQuaternion<double> * chrono::ImmQ_dt_complete(ChQuaternion<double> *mq,ChVector<double> *qimm_dt)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChQuaternion<double> *mqdt;
  ChQuaternion<double> *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar2 = *(undefined1 (*) [16])qimm_dt->m_data;
  dVar1 = qimm_dt->m_data[1];
  *(undefined1 (*) [16])(in_RDI->m_data + 1) = auVar2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = qimm_dt->m_data[2];
  in_RDI->m_data[3] = qimm_dt->m_data[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = mq->m_data[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1 * mq->m_data[2];
  auVar3 = vfnmsub132sd_fma(auVar2,auVar4,auVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = mq->m_data[3];
  auVar2 = vfnmadd231sd_fma(auVar3,auVar5,auVar2);
  in_RDI->m_data[0] = auVar2._0_8_ / mq->m_data[0];
  return in_RDI;
}

Assistant:

ChQuaternion<double> ImmQ_dt_complete(const ChQuaternion<double>& mq, const ChVector<double>& qimm_dt) {
    ChQuaternion<double> mqdt;
    mqdt.e1() = qimm_dt.x();
    mqdt.e2() = qimm_dt.y();
    mqdt.e3() = qimm_dt.z();
    mqdt.e0() = (-mq.e1() * mqdt.e1() - mq.e2() * mqdt.e2() - mq.e3() * mqdt.e3()) / mq.e0();
    return mqdt;
}